

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string.c
# Opt level: O0

natwm_error
string_get_delimiter(char *string,char delimiter,char **destination,size_t *length,_Bool consume)

{
  natwm_error splice_err;
  natwm_error find_err;
  size_t index;
  size_t *psStack_30;
  _Bool consume_local;
  size_t *length_local;
  char **destination_local;
  char *pcStack_18;
  char delimiter_local;
  char *string_local;
  
  _splice_err = 0;
  index._7_1_ = consume;
  psStack_30 = length;
  length_local = (size_t *)destination;
  destination_local._7_1_ = delimiter;
  pcStack_18 = string;
  string_local._4_4_ = string_find_char(string,delimiter,(size_t *)&splice_err);
  if (string_local._4_4_ == NO_ERROR) {
    if ((index._7_1_ & 1) != 0) {
      _splice_err = _splice_err + 1;
    }
    string_local._4_4_ = string_splice(pcStack_18,0,_splice_err,(char **)length_local,psStack_30);
    if (string_local._4_4_ == NO_ERROR) {
      string_local._4_4_ = NO_ERROR;
    }
  }
  return string_local._4_4_;
}

Assistant:

enum natwm_error string_get_delimiter(const char *string, char delimiter, char **destination,
                                      size_t *length, bool consume)
{
        size_t index = 0;
        enum natwm_error find_err = string_find_char(string, delimiter, &index);

        if (find_err != NO_ERROR) {
                return find_err;
        }

        if (consume) {
                ++index;
        }

        enum natwm_error splice_err = string_splice(string, 0, index, destination, length);

        if (splice_err != NO_ERROR) {
                return splice_err;
        }

        return NO_ERROR;
}